

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHull.cpp
# Opt level: O3

HaF32 __thiscall
HACD::HullLibrary::ComputeNormal(HullLibrary *this,HaF32 *n,HaF32 *A,HaF32 *B,HaF32 *C)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  
  fVar1 = (float)B[2] - (float)C[2];
  fVar10 = (float)*B - (float)*C;
  fVar2 = (float)B[1] - (float)C[1];
  fVar3 = (float)A[1] - (float)B[1];
  fVar4 = (float)A[2] - (float)B[2];
  fVar5 = (float)*A - (float)*B;
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar1)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar4))
  ;
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar10)),ZEXT416((uint)fVar5),ZEXT416((uint)fVar1)
                          );
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar2)),ZEXT416((uint)fVar10),ZEXT416((uint)fVar3)
                          );
  fVar10 = auVar8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar7,auVar7);
  auVar8 = vfmadd231ss_fma(auVar8,auVar9,auVar9);
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  uVar6 = vcmpss_avx512f(auVar8,ZEXT416(0x358637bd),1);
  fVar1 = (float)((uint)!(bool)((byte)uVar6 & 1) * (int)(1.0 / auVar8._0_4_));
  *n = (HaF32)(auVar7._0_4_ * fVar1);
  n[1] = (HaF32)(fVar10 * fVar1);
  n[2] = (HaF32)(auVar9._0_4_ * fVar1);
  return (HaF32)fVar1;
}

Assistant:

hacd::HaF32 HullLibrary::ComputeNormal(hacd::HaF32 *n,const hacd::HaF32 *A,const hacd::HaF32 *B,const hacd::HaF32 *C)
{
	hacd::HaF32 vx,vy,vz,wx,wy,wz,vw_x,vw_y,vw_z,mag;

	vx = (B[0] - C[0]);
	vy = (B[1] - C[1]);
	vz = (B[2] - C[2]);

	wx = (A[0] - B[0]);
	wy = (A[1] - B[1]);
	wz = (A[2] - B[2]);

	vw_x = vy * wz - vz * wy;
	vw_y = vz * wx - vx * wz;
	vw_z = vx * wy - vy * wx;

	mag = sqrtf((vw_x * vw_x) + (vw_y * vw_y) + (vw_z * vw_z));

	if ( mag < 0.000001f )
	{
		mag = 0;
	}
	else
	{
		mag = 1.0f/mag;
	}

	n[0] = vw_x * mag;
	n[1] = vw_y * mag;
	n[2] = vw_z * mag;

	return mag;
}